

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::Encode(Entity_Damage_Status_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference this_00;
  StandardVariable *pSVar3;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Entity_Damage_Status_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_DmgEnt);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32Padding);
  KDataStream::operator<<(pKVar2,this->m_ui16NumDmgDescRecs);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vDdRec);
  local_28._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vDdRec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Entity_Damage_Status_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_DmgEnt
           << m_ui32Padding
           << m_ui16NumDmgDescRecs;

    vector<StdVarPtr>::const_iterator citr = m_vDdRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDdRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}